

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> * __thiscall
TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_>::PopItem
          (TPZDohrPrecondV2SubDataList<long_double,_TPZDohrSubstructCondense<long_double>_> *this)

{
  size_type sVar1;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> *in_RDI;
  lock_guard<std::mutex> lock;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> *result;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>
  *in_stack_ffffffffffffffa8;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_> *this_00;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>
  *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>::
  TPZDohrPrecondV2SubData(in_stack_ffffffffffffffd0);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)this_00,(mutex_type *)in_stack_ffffffffffffffa8);
  sVar1 = std::__cxx11::
          list<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>_>_>
          ::size((list<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>_>_>
                  *)this_00);
  if (sVar1 != 0) {
    std::__cxx11::
    list<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>_>_>
    ::begin((list<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>_>_>
             *)in_stack_ffffffffffffffa8);
    std::
    _List_iterator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>_>::
    operator*((_List_iterator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>_>
               *)0x1f9dff1);
    TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>::operator=
              (this_00,in_stack_ffffffffffffffa8);
    std::__cxx11::
    list<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>_>_>
    ::pop_front((list<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>,_std::allocator<TPZDohrPrecondV2SubData<long_double,_TPZDohrSubstructCondense<long_double>_>_>_>
                 *)this_00);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f9e049);
  return in_RDI;
}

Assistant:

TPZDohrPrecondV2SubData<TVar, TSubStruct> PopItem()
	{
		TPZDohrPrecondV2SubData<TVar, TSubStruct> result;
        std::lock_guard<std::mutex> lock(fAccessLock);
		if (fWork.size()) {
			result = *fWork.begin();
			fWork.pop_front();
		}
		return result;
	}